

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O3

int FFSinternal_decode(FFSTypeHandle_conflict ioformat,char *src,void *dest,int to_buffer)

{
  FMFormat_conflict *pp_Var1;
  undefined1 uVar2;
  FMFormat_conflict p_Var3;
  FFSContext p_Var4;
  size_t sVar5;
  FFSTypeHandle_conflict p_Var6;
  ssize_t sVar7;
  ssize_t sVar8;
  FFSTypeHandle_conflict __dest;
  size_t __n;
  FFSTypeHandle_conflict __src;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong size;
  char *__src_00;
  _FFSBuffer *buf;
  undefined1 *puVar13;
  char *__dest_00;
  FFSTypeHandle_conflict p_Var14;
  _IOConversionStruct *conv;
  int record_len;
  IOConversionStruct null_conv;
  undefined8 local_158;
  FFSTypeHandle_conflict local_150;
  char *local_148;
  _FFSBuffer *local_140;
  ssize_t local_138;
  char *local_130;
  FFSTypeHandle_conflict local_128;
  ssize_t local_120;
  long local_118;
  char *local_110;
  _IOConversionStruct local_108;
  
  p_Var3 = ioformat->body;
  iVar9 = (p_Var3->server_ID).length;
  iVar11 = iVar9;
  if (p_Var3->variant != 0) {
    if (p_Var3->IOversion < 4) {
      iVar11 = iVar9 + 4;
    }
    else {
      iVar11 = iVar9 + 8;
    }
  }
  p_Var4 = ioformat->context;
  conv = ioformat->conversion;
  if (conv == (IOConversionPtr_conflict)0x0) {
    conv = &local_108;
    local_108.conversion_type = none_required;
    local_108.max_var_expansion = 1.0;
    local_108.conv_count = 0;
    local_108.base_size_delta = 0;
    local_108.context = p_Var4;
    local_108.ioformat = ioformat;
    local_108.native_field_list = (FMFieldList)0x0;
  }
  else if (p_Var4 != conv->context) {
    FFSinternal_decode_cold_1();
    return -1;
  }
  local_138 = CONCAT44(local_138._4_4_,to_buffer);
  local_120 = CONCAT44(local_120._4_4_,iVar11);
  if (p_Var3->variant == 0) {
    local_118 = (long)p_Var3->record_length;
  }
  else if (p_Var3->IOversion < 4) {
    local_158 = CONCAT44(local_158._4_4_,*(int *)(src + (ulong)(-iVar9 & 3) + (long)iVar9));
    iVar9 = *(int *)(src + (ulong)(-iVar9 & 3) + (long)iVar9);
    if (p_Var3->byte_reversal != 0) {
      puVar13 = (undefined1 *)((long)&local_158 + 3);
      lVar10 = 0;
      do {
        uVar2 = *(undefined1 *)((long)&local_158 + lVar10);
        *(undefined1 *)((long)&local_158 + lVar10) = *puVar13;
        *puVar13 = uVar2;
        lVar10 = lVar10 + 1;
        puVar13 = puVar13 + -1;
      } while (lVar10 != 2);
      iVar9 = (int)local_158;
    }
    local_118 = (long)iVar9;
  }
  else {
    local_158 = *(long *)(src + iVar9);
    local_118 = *(long *)(src + iVar9);
    if (p_Var3->byte_reversal != 0) {
      puVar13 = (undefined1 *)((long)&local_158 + 7);
      lVar10 = 0;
      do {
        uVar2 = *(undefined1 *)((long)&local_158 + lVar10);
        *(undefined1 *)((long)&local_158 + lVar10) = *puVar13;
        *puVar13 = uVar2;
        lVar10 = lVar10 + 1;
        puVar13 = puVar13 + -1;
        local_118 = local_158;
      } while (lVar10 != 4);
    }
  }
  p_Var14 = (FFSTypeHandle_conflict)(long)p_Var3->record_length;
  sVar5 = conv->base_size_delta;
  uVar12 = (ulong)(int)(p_Var3->record_length + 7U & 0xfffffff8);
  local_130 = (char *)((double)(local_118 - conv->ioformat->body->record_length) *
                      conv->max_var_expansion);
  buf = &p_Var4->tmp;
  local_150 = ioformat;
  local_148 = (char *)dest;
  local_140 = (_FFSBuffer *)src;
  make_tmp_buffer(buf,0);
  sVar7 = 0;
  if (local_148 == (char *)0x0) {
    size = (ulong)((long)&p_Var14->context + sVar5 + 7) & 0xfffffffffffffff8;
    if (size <= uVar12) {
      size = uVar12;
    }
    sVar7 = add_to_tmp_buffer(buf,size);
    if (sVar7 == -1) {
      return 0;
    }
  }
  local_120._0_4_ = (-(int)local_120 & 7U) + (int)local_120;
  __src_00 = (char *)((long)&local_140->tmp_buffer +
                     (long)(int)((-(int)local_120 & 7U) + (int)local_120));
  __dest_00 = local_148;
  local_128 = p_Var14;
  local_120 = sVar7;
  if (direct_to_mem < conv->conversion_type) {
    if ((local_140 == (_FFSBuffer *)0x0) || (__src_00 == local_148)) {
      sVar7 = add_to_tmp_buffer(buf,(long)(int)(local_150->body->record_length + 7U & 0xfffffff8));
      if (sVar7 == -1) {
        return 0;
      }
      __dest_00 = (char *)0x0;
    }
    else {
      sVar7 = 0;
      __dest_00 = __src_00;
    }
  }
  iVar9 = local_150->body->record_length;
  if (local_148 == (char *)0x0 || (int)local_138 == 0) {
    lVar10 = local_118 - uVar12;
    if ((long)(local_118 - uVar12) <= (long)(int)(double)local_130) {
      lVar10 = (long)(int)(double)local_130;
    }
    local_110 = __src_00;
    sVar8 = add_to_tmp_buffer(buf,lVar10 + (ulong)(-iVar9 & 7) + 7 & 0xfffffffffffffff8);
    if (sVar8 == -1) {
      return 0;
    }
    p_Var14 = (FFSTypeHandle_conflict)0x0;
    __src_00 = local_110;
  }
  else {
    p_Var14 = (FFSTypeHandle_conflict)
              (local_148 + ((long)iVar9 + conv->base_size_delta + 7 & 0xfffffffffffffff8));
    sVar8 = 0;
  }
  uVar12 = (ulong)(-(int)local_128 & 7);
  __src = (FFSTypeHandle_conflict)(__src_00 + (long)(uVar12 + (long)&local_128->context));
  lVar10 = sVar8;
  __dest = p_Var14;
  local_138 = sVar7;
  if (buffer_and_convert < conv->conversion_type) {
    if ((local_140 == (_FFSBuffer *)0x0) || (__src_00 == local_148)) {
      local_140 = buf;
      local_130 = __dest_00;
      local_128 = __src;
      lVar10 = add_to_tmp_buffer(buf,(local_118 - local_150->body->record_length) + 8);
      if (lVar10 == -1) {
        return 0;
      }
      __dest = (FFSTypeHandle_conflict)0x0;
      __src = local_128;
      buf = local_140;
      __dest_00 = local_130;
    }
    else {
      lVar10 = 0;
      __dest = __src;
    }
  }
  p_Var6 = local_150;
  if (local_148 == (char *)0x0) {
    local_148 = (char *)(local_120 + (long)buf->tmp_buffer);
  }
  if (__dest_00 == (char *)0x0) {
    __dest_00 = (char *)(local_138 + (long)buf->tmp_buffer);
  }
  if (p_Var14 == (FFSTypeHandle_conflict)0x0) {
    p_Var14 = (FFSTypeHandle_conflict)(sVar8 + (long)buf->tmp_buffer);
  }
  if (__dest == (FFSTypeHandle_conflict)0x0) {
    __dest = (FFSTypeHandle_conflict)(lVar10 + (long)buf->tmp_buffer);
  }
  if (__dest_00 != __src_00) {
    pp_Var1 = &local_150->body;
    local_150 = __dest;
    memcpy(__dest_00,__src_00,(long)(*pp_Var1)->record_length);
    __dest = local_150;
  }
  if ((__dest != __src) &&
     (__n = local_118 - (uVar12 + (long)p_Var6->body->record_length), 0 < (long)__n)) {
    memcpy(__dest,__src,__n);
  }
  if (conv->conversion_type != none_required) {
    FFSconvert_record(conv,__dest_00,local_148,p_Var14,__dest);
  }
  return 1;
}

Assistant:

static int
FFSinternal_decode(FFSTypeHandle ioformat, char *src, void *dest, int to_buffer)
{
    FFSContext iofile = ioformat->context;
    IOConversionPtr conv;
    int64_t input_record_len;
    IOConversionStruct null_conv;
    int align_pad;
    int header_size = FFSheader_size(ioformat);
    int data_align_pad;
    conversion_action params;

    conv = ioformat->conversion;

    if (conv == NULL) {
	null_conv.conversion_type = none_required;
	null_conv.max_var_expansion = 1.0;
	null_conv.conv_count = 0;
	null_conv.base_size_delta = 0;
	null_conv.context = iofile;
	null_conv.ioformat = ioformat;
	null_conv.native_field_list = NULL;
	conv = &null_conv;
    }
    if (iofile != conv->context) {
	fprintf(stderr, "IOFile and conversion mismatch\n");
	return -1;
    }
    if (ioformat == NULL)
	return 0;

    if (ioformat->body->variant) {
	if (ioformat->body->IOversion <= 3) {
	    FILE_INT record_len;
	    int len_align_pad = (4 - ioformat->body->server_ID.length) & 3;
	    FILE_INT *len_ptr = (FILE_INT *) (src + ioformat->body->server_ID.length +
					      len_align_pad);
	    memcpy(&record_len, len_ptr, 4);
	    if (ioformat->body->byte_reversal)
		byte_swap((char *) &record_len, 4);
	    input_record_len = record_len;
	} else {
	    uint64_t record_len;
	    uint64_t *len_ptr = (uint64_t *) (src + ioformat->body->server_ID.length);
	    memcpy(&record_len, len_ptr, 8);
	    if (ioformat->body->byte_reversal)
		byte_swap((char *) &record_len, 8);
	    input_record_len = record_len;
	}
    } else {
	input_record_len = ioformat->body->record_length;
    }
    align_pad = (8 - header_size) & 0x7;
    header_size += align_pad;
    data_align_pad = (8 - ioformat->body->record_length) & 0x7;

    params.cur_base = src + header_size;
    params.cur_variant = params.cur_base + ioformat->body->record_length +
	data_align_pad;
    params.final_base = dest;
    params.variant_with_base = to_buffer;
    if (!set_conversion_params(ioformat, input_record_len, conv, &params))
	return 0;

    /* update stats 
    iofile->stats.decode_bytes += input_record_len;
    iofile->stats.decode_msg_count++;*/

    if (params.src_address != params.cur_base) {
	memcpy(params.src_address, params.cur_base, ioformat->body->record_length);
    }
    if (params.src_string_address != params.cur_variant) {
	if (input_record_len - ioformat->body->record_length - data_align_pad > 0) {
	    memcpy(params.src_string_address, params.cur_variant,
		   input_record_len - ioformat->body->record_length - data_align_pad);
	}
    }
    if (conv->conversion_type != none_required) {
	FFSconvert_record(conv, params.src_address, params.dest_address,
			 params.final_string_address,
			 params.src_string_address);
    }
    return 1;
}